

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool __thiscall
fmt::v10::detail::
for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format-inl.h:1396:25)>
::anon_class_8_1_54a39806::anon_class_8_1_8991fb9c_for_f::operator()
          (anon_class_8_1_8991fb9c_for_f *this,uint32_t cp,string_view param_2)

{
  buffer<wchar_t> *this_00;
  char *message;
  wchar_t local_44;
  wchar_t local_40;
  wchar_t local_3c;
  runtime_error local_38 [20];
  wchar_t local_24;
  anon_class_8_1_8991fb9c_for_f *paStack_20;
  uint32_t cp_local;
  anon_class_8_1_8991fb9c_for_f *this_local;
  string_view param_2_local;
  
  param_2_local.data_ = (char *)param_2.size_;
  this_local = (anon_class_8_1_8991fb9c_for_f *)param_2.data_;
  this_00 = (buffer<wchar_t> *)this->this;
  local_24 = cp;
  paStack_20 = this;
  if (cp == 0xffffffff) {
    std::runtime_error::runtime_error(local_38,"invalid utf8");
    message = (char *)std::runtime_error::what();
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format-inl.h"
                ,0x575,message);
    std::runtime_error::~runtime_error(local_38);
  }
  if ((uint)local_24 < 0x10000) {
    local_3c = local_24;
    buffer<wchar_t>::push_back(this_00,&local_3c);
  }
  else {
    local_24 = local_24 + L'\xffff0000';
    local_40 = ((uint)local_24 >> 10) + L'\xd800';
    buffer<wchar_t>::push_back(this_00,&local_40);
    local_44 = (local_24 & 0x3ffU) + L'\xdc00';
    buffer<wchar_t>::push_back(this_00,&local_44);
  }
  return true;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}